

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

Maybe<double> __thiscall kj::_::tryParseDouble(_ *this,StringPtr *s)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  anon_union_8_1_a8c68091_for_NullableValue<double>_2 extraout_XMM0_Qa;
  anon_union_8_1_a8c68091_for_NullableValue<double>_2 extraout_XMM0_Qa_00;
  anon_union_8_1_a8c68091_for_NullableValue<double>_2 extraout_XMM0_Qa_01;
  anon_union_8_1_a8c68091_for_NullableValue<double>_2 aVar4;
  Maybe<double> MVar5;
  double local_30;
  double value;
  char *endPtr;
  StringPtr *local_18;
  StringPtr *s_local;
  
  local_18 = s;
  s_local = (StringPtr *)this;
  bVar1 = StringPtr::operator==(s,(void *)0x0);
  if (bVar1) {
    Maybe<double>::Maybe((Maybe<double> *)this);
    aVar4 = extraout_XMM0_Qa;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar3 = StringPtr::begin(local_18);
    local_30 = anon_unknown_0::NoLocaleStrtod(pcVar3,(char **)&value);
    pcVar3 = StringPtr::end(local_18);
    if ((char *)value == pcVar3) {
      Maybe<double>::Maybe((Maybe<double> *)this,&local_30);
      aVar4 = extraout_XMM0_Qa_01;
    }
    else {
      Maybe<double>::Maybe((Maybe<double> *)this);
      aVar4 = extraout_XMM0_Qa_00;
    }
  }
  MVar5.ptr.field_1.value = aVar4.value;
  MVar5.ptr._0_8_ = this;
  return (Maybe<double>)MVar5.ptr;
}

Assistant:

Maybe<double> tryParseDouble(const StringPtr& s) {
  if(s == nullptr) { return kj::none; }
  char *endPtr;
  errno = 0;
  auto value = _::NoLocaleStrtod(s.begin(), &endPtr);
  if (endPtr != s.end()) { return kj::none; }
#if _WIN32 || __CYGWIN__ || __BIONIC__
  if (isNaN(value)) {
    return kj::nan();
  }
#endif
  return value;
}